

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

int meatobj(monst *mtmp)

{
  short sVar1;
  obj *poVar2;
  obj *obj;
  boolean bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  permonst *ppVar8;
  uint uVar9;
  char *pcVar10;
  obj *obj_00;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  char buf [256];
  int local_148;
  char local_138 [264];
  
  local_138[0] = '\0';
  uVar6 = 0;
  if (mtmp->mtame == '\0') {
    obj_00 = level->objects[mtmp->mx][mtmp->my];
    if (obj_00 == (obj *)0x0) {
      bVar13 = false;
      iVar11 = 0;
    }
    else {
      iVar11 = 0;
      local_148 = 0;
      do {
        poVar2 = (obj_00->v).v_nexthere;
        if ((((*(ushort *)&objects[obj_00->otyp].field_0x11 & 0x1f0) < 0x90) &&
            (bVar3 = obj_resists(obj_00,5,0x5f), bVar3 == '\0')) &&
           (iVar4 = touch_artifact(obj_00,mtmp), iVar4 != 0)) {
          sVar1 = obj_00->otyp;
          if ((((sVar1 != 0xb4) && (sVar1 != 0xcb)) &&
              ((sVar1 != 0x10e ||
               ((1 < obj_00->corpsenm - 0xbU || ((mtmp->mintrinsics & 0x80) != 0)))))) &&
             (((*(uint *)&obj_00->field_0x4a >> 0xd & 1) == 0 || ((ushort)(sVar1 - 0xdaU) < 3)))) {
            if ((flags.verbose != '\0' & (byte)viz_array[mtmp->my][mtmp->mx] >> 1) == 1) {
              pcVar7 = Monnam(mtmp);
              pcVar10 = distant_name(obj_00,doname);
              pline("%s eats %s!",pcVar7,pcVar10);
            }
            else if (flags.soundok != '\0' && flags.verbose != '\0') {
              You_hear("a slurping sound.");
            }
            iVar4 = mtmp->mhpmax;
            if (mtmp->mhp < iVar4) {
              iVar5 = mtmp->mhp + (uint)objects[obj_00->otyp].oc_weight;
              if (iVar4 <= iVar5) {
                iVar5 = iVar4;
              }
              mtmp->mhp = iVar5;
            }
            if (obj_00->cobj != (obj *)0x0) {
              while (obj = obj_00->cobj, obj != (obj *)0x0) {
                obj_extract_self(obj);
                if ((obj_00->otyp == 0xdd) && (obj->otyp == 0x10e)) {
                  obj->age = moves - obj->age;
                  start_corpse_timeout(obj);
                }
                mpickobj(mtmp,obj);
              }
            }
            uVar12 = 0;
            uVar6 = (ushort)obj_00->otyp - 0x10e;
            if ((uVar6 < 0x1c) && ((0x8000003U >> (uVar6 & 0x1f) & 1) != 0)) {
              uVar9 = obj_00->corpsenm - 0x117;
              if (uVar9 < 0x3f) {
                uVar12 = 0x4002000000000001 >> ((byte)uVar9 & 0x3f);
              }
              else {
                uVar12 = 0;
              }
            }
            bVar13 = false;
            if ((uVar6 < 0x1c) && ((0x8000003U >> (uVar6 & 0x1f) & 1) != 0)) {
              bVar13 = obj_00->corpsenm == 0xec;
            }
            bVar14 = false;
            if ((uVar6 < 0x1c) && (bVar14 = false, (0x8000003U >> (uVar6 & 0x1f) & 1) != 0)) {
              bVar14 = obj_00->corpsenm == 0x119;
            }
            delobj(obj_00);
            ppVar8 = mtmp->data;
            if ((uVar12 & 1) == 0) {
              if (bVar13) {
                ppVar8 = grow_up(mtmp,(monst *)0x0);
              }
              else if (bVar14) {
                mtmp->mhp = mtmp->mhpmax;
              }
            }
            else {
              iVar4 = newcham(level,mtmp,(permonst *)0x0,'\0','\0');
              if (iVar4 != 0) {
                ppVar8 = mtmp->data;
              }
            }
            if (ppVar8 != mons + 10) {
              return (ppVar8 == (permonst *)0x0) + 1;
            }
            local_148 = local_148 + 1;
            goto LAB_001e6841;
          }
        }
        else {
          if (((obj_00->oclass != '\x0e') && (obj_00 != uball)) &&
             ((obj_00 != uchain &&
              (((obj_00->field_0x4b & 0x20) == 0 || ((ushort)(obj_00->otyp - 0xdaU) < 3)))))) {
            if (iVar11 == 0) {
              pcVar7 = Monnam(mtmp);
              pcVar10 = distant_name(obj_00,doname);
              sprintf(local_138,"%s engulfs %s.",pcVar7,pcVar10);
            }
            else if (iVar11 + 1 == 2) {
              pcVar7 = Monnam(mtmp);
              sprintf(local_138,"%s engulfs several objects.",pcVar7);
            }
            obj_extract_self(obj_00);
            mpickobj(mtmp,obj_00);
            iVar11 = iVar11 + 1;
          }
LAB_001e6841:
          if ((mtmp->field_0x60 & 2) != 0) {
            newsym((int)mtmp->mx,(int)mtmp->my);
          }
        }
        obj_00 = poVar2;
      } while (poVar2 != (obj *)0x0);
      bVar13 = 0 < local_148;
    }
    if (0 < iVar11) {
      if ((((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) || (flags.verbose == '\0')) ||
         (local_138[0] == '\0')) {
        if (flags.soundok != '\0' && flags.verbose != '\0') {
          pcVar7 = "several";
          if (iVar11 == 1) {
            pcVar7 = "a";
          }
          pcVar10 = "s";
          if (iVar11 == 1) {
            pcVar10 = "";
          }
          You_hear("%s slurping sound%s.",pcVar7,pcVar10);
        }
      }
      else {
        pline("%s",local_138);
      }
    }
    uVar6 = (uint)(byte)(bVar13 | 0 < iVar11);
  }
  return uVar6;
}

Assistant:

int meatobj(struct monst *mtmp)
{
	struct obj *otmp, *otmp2;
	const struct permonst *ptr;
	int poly, grow, heal, count = 0, ecount = 0;
	char buf[BUFSZ];

	buf[0] = '\0';
	/* If a pet, eating is handled separately, in dog.c */
	if (mtmp->mtame) return 0;

	/* Eats organic objects, including cloth and wood, if there */
	/* Engulfs others, except huge rocks and metal attached to player */
	for (otmp = level->objects[mtmp->mx][mtmp->my]; otmp; otmp = otmp2) {
	    otmp2 = otmp->nexthere;
	    if (is_organic(otmp) && !obj_resists(otmp, 5, 95) &&
		    touch_artifact(otmp,mtmp)) {
		if (otmp->otyp == CORPSE && touch_petrifies(&mons[otmp->corpsenm]) &&
			!resists_ston(mtmp))
		    continue;
		if (otmp->otyp == AMULET_OF_STRANGULATION ||
				otmp->otyp == RIN_SLOW_DIGESTION)
		    continue;
		if (Is_prize(otmp))
		    continue;
		++count;
		if (cansee(mtmp->mx,mtmp->my) && flags.verbose)
		    pline("%s eats %s!", Monnam(mtmp),
			    distant_name(otmp, doname));
		else if (flags.soundok && flags.verbose)
		    You_hear("a slurping sound.");
		/* Heal up to the object's weight in hp */
		if (mtmp->mhp < mtmp->mhpmax) {
		    mtmp->mhp += objects[otmp->otyp].oc_weight;
		    if (mtmp->mhp > mtmp->mhpmax) mtmp->mhp = mtmp->mhpmax;
		}
		if (Has_contents(otmp)) {
		    struct obj *otmp3;
		    /* contents of eaten containers become engulfed; this
		       is arbitrary, but otherwise g.cubes are too powerful */
		    while ((otmp3 = otmp->cobj) != 0) {
			obj_extract_self(otmp3);
			if (otmp->otyp == ICE_BOX && otmp3->otyp == CORPSE) {
			    otmp3->age = moves - otmp3->age;
			    start_corpse_timeout(otmp3);
			}
			mpickobj(mtmp, otmp3);
		    }
		}
		poly = polyfodder(otmp);
		grow = mlevelgain(otmp);
		heal = mhealup(otmp);
		delobj(otmp);		/* munch */
		ptr = mtmp->data;
		if (poly) {
		    if (newcham(level, mtmp, NULL, FALSE, FALSE))
			ptr = mtmp->data;
		} else if (grow) {
		    ptr = grow_up(mtmp, NULL);
		} else if (heal) {
		    mtmp->mhp = mtmp->mhpmax;
		}
		/* in case it polymorphed or died */
		if (ptr != &mons[PM_GELATINOUS_CUBE])
		    return !ptr ? 2 : 1;
	    } else if (otmp->oclass != ROCK_CLASS &&
		       otmp != uball && otmp != uchain &&
		       !Is_prize(otmp)) {
		++ecount;
		if (ecount == 1) {
			sprintf(buf, "%s engulfs %s.", Monnam(mtmp),
			    distant_name(otmp,doname));
		} else if (ecount == 2)
			sprintf(buf, "%s engulfs several objects.", Monnam(mtmp));
		obj_extract_self(otmp);
		mpickobj(mtmp, otmp);	/* slurp */
	    }
	    /* Engulf & devour is instant, so don't set meating */
	    if (mtmp->minvis) newsym(mtmp->mx, mtmp->my);
	}
	if (ecount > 0) {
	    if (cansee(mtmp->mx, mtmp->my) && flags.verbose && buf[0])
		pline("%s", buf);
	    else if (flags.soundok && flags.verbose)
	    	You_hear("%s slurping sound%s.",
			ecount == 1 ? "a" : "several",
			ecount == 1 ? "" : "s");
	}
	return ((count > 0) || (ecount > 0)) ? 1 : 0;
}